

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

Hash __thiscall
Fossilize::StateRecorder::Impl::record_shader_module
          (Impl *this,WorkItem *record_item,bool dependent_record)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *blob;
  VkShaderModuleCreateInfo *create_info;
  pointer puVar1;
  VkShaderModuleCreateInfo *pVVar2;
  bool bVar3;
  char cVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  mapped_type *ppVVar7;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *ident;
  VkShaderModuleCreateInfo *__k;
  Impl *this_00;
  Hash hash_00;
  Hash hash;
  VkShaderModule_T *vk_object;
  VkShaderModuleCreateInfo *create_info_copy;
  
  create_info = (VkShaderModuleCreateInfo *)record_item->create_info;
  hash = record_item->custom_hash;
  vk_object = (VkShaderModule_T *)record_item->handle;
  if (hash == 0) {
    if (create_info == (VkShaderModuleCreateInfo *)0x0) {
      std::
      _Hashtable<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_long>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&(this->shader_module_to_hash)._M_h,&vk_object);
      return hash;
    }
    __k = (VkShaderModuleCreateInfo *)&hash;
    Hashing::compute_hash_shader_module(create_info,(Hash *)__k);
    if (hash == 0) {
      hash_00 = 0;
      goto LAB_00115ab1;
    }
  }
  hash_00 = hash;
  __k = (VkShaderModuleCreateInfo *)0x4;
  register_on_use(this,RESOURCE_SHADER_MODULE,hash);
LAB_00115ab1:
  if (record_item->handle != 0) {
    __k = (VkShaderModuleCreateInfo *)&vk_object;
    pmVar5 = std::__detail::
             _Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_long>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_long>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->shader_module_to_hash,(key_type *)__k);
    *pmVar5 = hash_00;
  }
  if (this->database_iface == (DatabaseInterface *)0x0) {
    __k = (VkShaderModuleCreateInfo *)&hash;
    sVar6 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkShaderModuleCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModuleCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(&(this->shader_modules)._M_h,(key_type *)__k);
    if (sVar6 == 0) {
      create_info_copy = (VkShaderModuleCreateInfo *)0x0;
      __k = create_info;
      bVar3 = copy_shader_module(this,create_info,&this->allocator,false,&create_info_copy);
      pVVar2 = create_info_copy;
      if (bVar3) {
        __k = (VkShaderModuleCreateInfo *)&hash;
        ppVVar7 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkShaderModuleCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModuleCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkShaderModuleCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModuleCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->shader_modules,(key_type *)__k);
        *ppVVar7 = pVVar2;
      }
    }
  }
  else {
    if ((this->record_data).write_database_entries == true) {
      blob = &(this->record_data).blob;
      bVar3 = register_application_link_hash(this,RESOURCE_SHADER_MODULE,hash_00,blob);
      if (bVar3) {
        (this->record_data).need_flush = true;
      }
      this_00 = (Impl *)this->database_iface;
      __k = (VkShaderModuleCreateInfo *)0x4;
      cVar4 = (*(code *)(this_00->allocator).impl[1].blocks.
                        super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
                        ._M_impl.super__Vector_impl_data._M_finish)(this_00,4,hash_00);
      if (cVar4 == '\0') {
        serialize_shader_module(this_00,hash_00,create_info,blob,&this->allocator);
        puVar1 = (this->record_data).blob.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        __k = (VkShaderModuleCreateInfo *)0x4;
        (*this->database_iface->_vptr_DatabaseInterface[4])
                  (this->database_iface,4,hash_00,puVar1,
                   (long)(this->record_data).blob.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar1,
                   (ulong)(this->record_data).payload_flags);
        (this->record_data).need_flush = true;
      }
    }
    if (dependent_record) {
      return hash;
    }
    ScratchAllocator::reset(&this->allocator);
  }
  if ((this->module_identifier_database_iface != (DatabaseInterface *)0x0 && !dependent_record) &&
     (ident = find_pnext<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>
                        ((VkStructureType)create_info->pNext,__k),
     ident != (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0)) {
    register_module_identifier(this,(VkShaderModule)hash,ident);
  }
  return hash;
}

Assistant:

Hash StateRecorder::Impl::record_shader_module(const WorkItem &record_item, bool dependent_record)
{
	auto *create_info = reinterpret_cast<VkShaderModuleCreateInfo *>(record_item.create_info);
	Hash hash = record_item.custom_hash;
	auto vk_object = api_object_cast<VkShaderModule>(record_item.handle);

	if (hash == 0)
	{
		if (!create_info || !Hashing::compute_hash_shader_module(*create_info, &hash))
		{
			shader_module_to_hash.erase(vk_object);
			return hash;
		}
	}

	if (hash)
		register_on_use(RESOURCE_SHADER_MODULE, hash);

	if (record_item.handle != 0)
		shader_module_to_hash[vk_object] = hash;

	auto &blob = record_data.blob;

	if (database_iface)
	{
		if (record_data.write_database_entries)
		{
			if (register_application_link_hash(RESOURCE_SHADER_MODULE, hash, blob))
				record_data.need_flush = true;

			if (!database_iface->has_entry(RESOURCE_SHADER_MODULE, hash))
			{
				if (serialize_shader_module(hash, *create_info, blob, allocator))
				{
					database_iface->write_entry(RESOURCE_SHADER_MODULE, hash, blob.data(), blob.size(),
												record_data.payload_flags);
					record_data.need_flush = true;
				}
			}
		}

		// If this is called as part of a graphics pipeline library call, we must be very careful not
		// to reclaim the scratch allocator memory (yet). Otherwise we risk corruption.
		if (!dependent_record)
			allocator.reset();
	}
	else
	{
		// Retain for combined serialize() later.
		if (!shader_modules.count(hash))
		{
			VkShaderModuleCreateInfo *create_info_copy = nullptr;
			if (copy_shader_module(create_info, allocator, false, &create_info_copy))
				shader_modules[hash] = create_info_copy;
		}
	}

	// If we're a dependent record, the pipeline remapping logic will ensure to register the module.
	if (module_identifier_database_iface && !dependent_record)
	{
		auto *identifier = find_pnext<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>(
				VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT, create_info->pNext);
		if (identifier)
			register_module_identifier(api_object_cast<VkShaderModule>(hash), *identifier);
	}

	return hash;
}